

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwPortTest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  AmpIO *pAVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  AmpIO *pAVar7;
  ushort uVar8;
  timeval *__tv;
  size_t i_1;
  long lVar9;
  long lVar10;
  byte board_id;
  size_t i;
  ulong uVar11;
  __suseconds_t *p_Var12;
  uint32_t sdata;
  size_t i_3;
  timeval local_d58 [99];
  undefined1 *puStack_720;
  stringstream local_718 [8];
  stringstream debugStream;
  undefined1 local_590 [8];
  FirewirePort fwport;
  char local_7c [4];
  undefined1 auStack_78 [4];
  char short_options [4];
  timeval start;
  undefined1 auStack_58 [8];
  vector<AmpIO_*,_std::allocator<AmpIO_*>_> BoardList;
  quadlet_t local_34 [2];
  quadlet_t dataQuadlet;
  
  auStack_58 = (undefined1  [8])0x0;
  BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fwport.old_reset_handler = (bus_reset_handler_t)0x300000002;
  builtin_strncpy(local_7c,"hp:",4);
  iVar5 = 0;
  while( true ) {
    while( true ) {
      puStack_720 = (undefined1 *)0x1037b0;
      iVar4 = getopt(argc,argv,local_7c);
      if (iVar4 != 0x68) break;
      puStack_720 = (undefined1 *)0x1037ba;
      ShowUsage();
    }
    if (iVar4 == -1) break;
    if (iVar4 != 0x70) {
      puStack_720 = &LAB_00103c66;
      abort();
    }
    puStack_720 = (undefined1 *)0x1037d9;
    iVar5 = atoi(_optarg);
    puStack_720 = (undefined1 *)0x1037ea;
    poVar6 = std::operator<<((ostream *)&std::cout,"using port number");
    puStack_720 = (undefined1 *)0x1037f2;
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  puStack_720 = (undefined1 *)0x103803;
  std::__cxx11::stringstream::stringstream(local_718,_S_out|_S_in);
  puStack_720 = (undefined1 *)0x103818;
  FirewirePort::FirewirePort((FirewirePort *)local_590,iVar5,(ostream *)&std::cout);
  if (fwport.super_BasePort.Board2Node._24_8_ == 0) {
    puStack_720 = (undefined1 *)0x103c24;
    poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to initialize firewire port");
    puStack_720 = (undefined1 *)0x103c2c;
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar5 = 1;
  }
  else {
    puStack_720 = (undefined1 *)0x103839;
    poVar6 = std::operator<<((ostream *)&std::cout,"Open port on ");
    puStack_720 = (undefined1 *)0x103843;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
    puStack_720 = (undefined1 *)0x10384b;
    std::endl<char,std::char_traits<char>>(poVar6);
    __tv = (timeval *)auStack_78;
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      puStack_720 = (undefined1 *)0x10386d;
      pAVar7 = (AmpIO *)operator_new(0xe58);
      uVar1 = *(uint *)((long)&fwport.old_reset_handler + lVar9 * 4);
      board_id = (byte)uVar1;
      puStack_720 = (undefined1 *)0x103884;
      AmpIO::AmpIO(pAVar7,board_id);
      puStack_720 = (undefined1 *)0x103894;
      _auStack_78 = pAVar7;
      std::vector<AmpIO*,std::allocator<AmpIO*>>::emplace_back<AmpIO*>
                ((vector<AmpIO*,std::allocator<AmpIO*>> *)auStack_58,(AmpIO **)__tv);
      puStack_720 = (undefined1 *)0x1038a8;
      FirewirePort::AddBoard
                ((FirewirePort *)local_590,(BoardIO *)*(pointer)((long)auStack_58 + lVar9 * 8));
      puStack_720 = (undefined1 *)0x1038b7;
      poVar6 = std::operator<<((ostream *)&std::cout,"new board with node_id = ");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      uVar8 = 0x40;
      if (board_id < 0x10) {
        uVar8 = fwport.super_BasePort.Board2Node[(ulong)(uVar1 & 0xf) - 4];
      }
      puStack_720 = (undefined1 *)0x1038ee;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar8);
      puStack_720 = (undefined1 *)0x1038f6;
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    puStack_720 = (undefined1 *)0x10391c;
    bVar3 = BasePort::WriteQuadlet((BasePort *)local_590,'?',0xffffff000003,0x88380000);
    if (!bVar3) {
      puStack_720 = (undefined1 *)0x103933;
      poVar6 = std::operator<<((ostream *)&std::cerr,"Quadlet broadcast error");
      puStack_720 = (undefined1 *)0x10393b;
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    uVar11 = 0;
    while( true ) {
      local_34[0] = 0;
      if ((ulong)((long)BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>._M_impl.
                        super__Vector_impl_data._M_start - (long)auStack_58 >> 3) <= uVar11) break;
      puStack_720 = (undefined1 *)0x103989;
      BasePort::ReadQuadlet
                ((BasePort *)local_590,
                 ((*(pointer)((long)auStack_58 + uVar11 * 8))->super_FpgaIO).super_BoardIO.BoardId,3
                 ,local_34);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      puStack_720 = (undefined1 *)0x1039ab;
      poVar6 = std::operator<<((ostream *)&std::cout,"Board ");
      puStack_720 = (undefined1 *)0x1039bf;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(uint)((*(pointer)((long)auStack_58 + uVar11 * 8))->super_FpgaIO).
                                       super_BoardIO.BoardId);
      puStack_720 = (undefined1 *)0x1039ca;
      poVar6 = std::operator<<(poVar6," watchdog = ");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
      puStack_720 = (undefined1 *)0x1039ec;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      puStack_720 = (undefined1 *)0x1039f4;
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar11 = uVar11 + 1;
    }
    puStack_720 = (undefined1 *)0xf;
    for (uVar11 = 0;
        uVar11 < (ulong)((long)BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3);
        uVar11 = uVar11 + 1) {
      puStack_720 = (undefined1 *)0x103a23;
      AmpIO::WriteSafetyRelay(*(pointer)((long)auStack_58 + uVar11 * 8),true);
      puStack_720 = (undefined1 *)0x103a33;
      AmpIO::WritePowerEnable(*(pointer)((long)auStack_58 + uVar11 * 8),true);
      puStack_720 = (undefined1 *)0x103a3d;
      usleep(40000);
      puStack_720 = (undefined1 *)0x103a50;
      AmpIO::WriteAmpEnable(*(pointer)((long)auStack_58 + uVar11 * 8),0xf,0xf);
    }
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      pAVar7 = *(pointer)((long)auStack_58 + lVar9 * 8);
      sdata = 0x8000;
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        puStack_720 = (undefined1 *)0x103a8b;
        AmpIO::SetMotorCurrent(pAVar7,(uint)lVar10,sdata);
        sdata = sdata + 0x200;
      }
    }
    lVar9 = 100;
    lVar10 = 0;
    while( true ) {
      gettimeofday(__tv,(__timezone_ptr_t)0x0);
      bVar3 = lVar9 == 0;
      lVar9 = lVar9 + -1;
      if (bVar3) break;
      BasePort::ReadAllBoardsBroadcast((BasePort *)local_590);
      BasePort::WriteAllBoardsBroadcast((BasePort *)local_590);
      __tv = local_d58 + lVar10;
      lVar10 = lVar10 + 1;
    }
    p_Var12 = &local_d58[0].tv_usec;
    pAVar7 = _auStack_78;
    for (lVar9 = 0; lVar9 != 100; lVar9 = lVar9 + 1) {
      pAVar2 = (AmpIO *)((timeval *)(p_Var12 + -1))->tv_sec;
      lVar10 = *p_Var12;
      poVar6 = std::operator<<((ostream *)&std::cout,"time ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)lVar9);
      poVar6 = std::operator<<(poVar6," = ");
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar6 = std::ostream::_M_insert<double>
                         ((double)((long)pAVar2 - (long)pAVar7) * 1000000.0 +
                          (double)(lVar10 - start.tv_sec) + 0.5);
      std::endl<char,std::char_traits<char>>(poVar6);
      p_Var12 = p_Var12 + 2;
      start.tv_sec = lVar10;
      pAVar7 = pAVar2;
    }
    for (uVar11 = 0;
        uVar11 < (ulong)((long)BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3);
        uVar11 = uVar11 + 1) {
      AmpIO::WriteSafetyRelay(*(pointer)((long)auStack_58 + uVar11 * 8),false);
      AmpIO::WriteAmpEnable(*(pointer)((long)auStack_58 + uVar11 * 8),0xf,0);
      AmpIO::WritePowerEnable(*(pointer)((long)auStack_58 + uVar11 * 8),false);
      FirewirePort::RemoveBoard
                ((FirewirePort *)local_590,
                 ((*(pointer)((long)auStack_58 + uVar11 * 8))->super_FpgaIO).super_BoardIO.BoardId);
    }
    iVar5 = 0;
  }
  puStack_720 = (undefined1 *)0x103c3b;
  FirewirePort::~FirewirePort((FirewirePort *)local_590);
  puStack_720 = (undefined1 *)0x103c47;
  std::__cxx11::stringstream::~stringstream(local_718);
  puStack_720 = (undefined1 *)0x103c50;
  std::_Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>::~_Vector_base
            ((_Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_> *)auStack_58);
  return iVar5;
}

Assistant:

int main(int argc, char** argv)
{
    // declare variables and default values
    int port = 0;
    const size_t numBoards = 4;
    int board_id[numBoards] = {BoardIO::MAX_BOARDS, BoardIO::MAX_BOARDS};
    std::vector<AmpIO*> BoardList;

    // set board id
    board_id[0] = 2;
    board_id[1] = 3;
    board_id[2] = 6;
    board_id[3] = 7;

    // command line option setup
    const char short_options[] = "hp:";
    int next_option;
    do {
        next_option = getopt(argc, argv, short_options);
        switch (next_option)
        {
        case 'h':
            ShowUsage();
            break;
        case 'p':
            port = atoi(optarg);
            std::cout << "using port number" << std::endl;
            break;
        case -1:  // parsing done
            break;
        default:  // should NEVER happen
            abort();
        }
    }
    while (next_option != -1);

    // ---------------------------------------------------
    // Firewire port
    // ZC: really this port number should be interactive
    // ---------------------------------------------------
    std::stringstream debugStream(std::stringstream::out|std::stringstream::in);
    FirewirePort fwport(port, std::cout);
    if (!fwport.IsOK()) {
        std::cerr << "Failed to initialize firewire port" << std::endl;
        return EXIT_FAILURE;
    } else {
        std::cout << "Open port on " << port << std::endl;
    }

    // Create AmpIO board 1 and 2
    for (size_t i = 0; i < numBoards; i++) {
        BoardList.push_back(new AmpIO(board_id[i]));
        fwport.AddBoard(BoardList[i]);
        std::cout << "new board with node_id = " << std::dec
                  << fwport.GetNodeId(board_id[i]) << std::endl;
    }

    // ----- ---------------------------------
    // Quadlet broadcast
    // ---------------------------------------
    bool rc;
    nodeaddr_t nodeaddress_wd = 0xffffff000003;
    rc = fwport.WriteQuadlet(FW_NODE_BROADCAST, nodeaddress_wd, bswap_32(0x3888));
    if (!rc) {
        std::cerr << "Quadlet broadcast error" << std::endl;
    }

    // now read back and verify
    quadlet_t dataQuadlet = 0x0000;
    for (size_t i = 0; i < BoardList.size(); i++) {
        fwport.ReadQuadlet(BoardList[i]->GetBoardId(), 0x03, dataQuadlet);
        std::cout << std::dec << "Board " << (int) BoardList[i]->GetBoardId()
                  << " watchdog = " << std::hex << bswap_32(dataQuadlet) << std::endl;
        dataQuadlet = 0x0000; // clear value
    }

    // ----- ---------------------------------
    // Block broadcast
    // --------------------------------------
    for (size_t i = 0; i < BoardList.size(); i++) {
        BoardList[i]->WriteSafetyRelay(true);
        BoardList[i]->WritePowerEnable(true);
        usleep(40000); // sleep 40 ms
        BoardList[i]->WriteAmpEnable(0x0f, 0x0f);
    }

    AmpIO* board;
    for (size_t i = 0; i < numBoards; i++) {
        board = BoardList[i];
        // set current for all boards
        for (size_t j = 0; j < 4; j++) {
            board->SetMotorCurrent(j, 0x8000 + 0x200 * j);
        }
    }

	
    // ----- ---------------------------------
    // Broadcast Write/Read boards
    // ---------------------------------------

    int counter = 0;
    int csize = 100;
    timeval start, prev;
    timeval stop[csize];

    gettimeofday(&start, NULL);
    while(counter < csize){
        counter++;
        fwport.ReadAllBoardsBroadcast();
        fwport.WriteAllBoardsBroadcast();
        gettimeofday(&stop[counter-1], NULL);
    }

    prev = start;
    for (int i = 0; i < csize; i++) {
        double mtime;
        mtime = (stop[i].tv_sec - prev.tv_sec) * 1000000.0 +
                (stop[i].tv_usec - prev.tv_usec) + 0.5;
        prev = stop[i];

        std::cout << "time " << i << " = " << std::dec << mtime << std::endl;
    }


    // Shut down boards and remove from port
    for (size_t i = 0; i < BoardList.size(); i++) {
        BoardList[i]->WriteSafetyRelay(false);
        BoardList[i]->WriteAmpEnable(0x0f, 0);   // Turn power off
        BoardList[i]->WritePowerEnable(false);   // Turn power off
        fwport.RemoveBoard(BoardList[i]->GetBoardId());
    }

    return EXIT_SUCCESS;
}